

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.c
# Opt level: O2

axbStatus_t axbMatSetValuesDense(axbMat_s *mat,void *values,axbDataType_t values_datatype)

{
  uint uVar1;
  axbStatus_t aVar2;
  
  if (mat->init == 0x1d233) {
    if (mat->storage_type == AXB_STORAGE_DENSE) {
      uVar1 = axbMemBackendCopyIn(mat->memBackend,values,values_datatype,mat->values,
                                  mat->values_datatype,mat->cols * mat->rows);
      if (uVar1 != 0) {
        fprintf(_stderr,"ERROR in %s line %d: Code %d.\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/mat.c"
                ,0xb3,(ulong)uVar1);
        __assert_fail("status==0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/mat.c"
                      ,0xb3,
                      "axbStatus_t axbMatSetValuesDense(struct axbMat_s *, void *, axbDataType_t)");
      }
    }
    else {
      if (mat->storage_type != AXB_STORAGE_CSR) {
        return 1;
      }
      uVar1 = axbMemBackendFree(mat->memBackend,mat->row_markers);
      if (uVar1 != 0) {
        fprintf(_stderr,"ERROR in %s line %d: Code %d.\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/mat.c"
                ,0x95,(ulong)uVar1);
        __assert_fail("status==0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/mat.c"
                      ,0x95,
                      "axbStatus_t axbMatSetValuesDense(struct axbMat_s *, void *, axbDataType_t)");
      }
      uVar1 = axbMemBackendFree(mat->memBackend,mat->col_indices);
      if (uVar1 != 0) {
        fprintf(_stderr,"ERROR in %s line %d: Code %d.\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/mat.c"
                ,0x96,(ulong)uVar1);
        __assert_fail("status==0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/mat.c"
                      ,0x96,
                      "axbStatus_t axbMatSetValuesDense(struct axbMat_s *, void *, axbDataType_t)");
      }
      uVar1 = axbMemBackendFree(mat->memBackend,mat->values);
      if (uVar1 != 0) {
        fprintf(_stderr,"ERROR in %s line %d: Code %d.\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/mat.c"
                ,0x97,(ulong)uVar1);
        __assert_fail("status==0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/mat.c"
                      ,0x97,
                      "axbStatus_t axbMatSetValuesDense(struct axbMat_s *, void *, axbDataType_t)");
      }
      uVar1 = axbMemBackendMalloc(mat->memBackend,mat->rows * 4 + 4,&mat->row_markers);
      if (uVar1 != 0) {
        fprintf(_stderr,"ERROR in %s line %d: Code %d.\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/mat.c"
                ,0x99,(ulong)uVar1);
        __assert_fail("status==0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/mat.c"
                      ,0x99,
                      "axbStatus_t axbMatSetValuesDense(struct axbMat_s *, void *, axbDataType_t)");
      }
      uVar1 = axbMemBackendMalloc(mat->memBackend,mat->rows * mat->cols * 4,&mat->col_indices);
      if (uVar1 != 0) {
        fprintf(_stderr,"ERROR in %s line %d: Code %d.\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/mat.c"
                ,0x9a,(ulong)uVar1);
        __assert_fail("status==0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/mat.c"
                      ,0x9a,
                      "axbStatus_t axbMatSetValuesDense(struct axbMat_s *, void *, axbDataType_t)");
      }
      uVar1 = axbMemBackendMalloc(mat->memBackend,mat->rows * mat->cols * 8,&mat->values);
      if (uVar1 != 0) {
        fprintf(_stderr,"ERROR in %s line %d: Code %d.\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/mat.c"
                ,0x9b,(ulong)uVar1);
        __assert_fail("status==0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/mat.c"
                      ,0x9b,
                      "axbStatus_t axbMatSetValuesDense(struct axbMat_s *, void *, axbDataType_t)");
      }
      uVar1 = axbMemBackendCopyIn(mat->memBackend,values,values_datatype,mat->row_markers,
                                  mat->row_markers_datatype,mat->rows + 1);
      if (uVar1 != 0) {
        fprintf(_stderr,"ERROR in %s line %d: Code %d.\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/mat.c"
                ,0xaa,(ulong)uVar1);
        __assert_fail("status==0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/mat.c"
                      ,0xaa,
                      "axbStatus_t axbMatSetValuesDense(struct axbMat_s *, void *, axbDataType_t)");
      }
      uVar1 = axbMemBackendCopyIn(mat->memBackend,values,values_datatype,mat->col_indices,
                                  mat->col_indices_datatype,mat->cols * mat->rows);
      if (uVar1 != 0) {
        fprintf(_stderr,"ERROR in %s line %d: Code %d.\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/mat.c"
                ,0xab,(ulong)uVar1);
        __assert_fail("status==0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/mat.c"
                      ,0xab,
                      "axbStatus_t axbMatSetValuesDense(struct axbMat_s *, void *, axbDataType_t)");
      }
      uVar1 = axbMemBackendCopyIn(mat->memBackend,values,values_datatype,mat->values,
                                  mat->values_datatype,mat->cols * mat->rows);
      if (uVar1 != 0) {
        fprintf(_stderr,"ERROR in %s line %d: Code %d.\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/mat.c"
                ,0xac,(ulong)uVar1);
        __assert_fail("status==0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/mat.c"
                      ,0xac,
                      "axbStatus_t axbMatSetValuesDense(struct axbMat_s *, void *, axbDataType_t)");
      }
    }
    aVar2 = 0;
  }
  else {
    fprintf(_stderr,"ERROR in %s: Matrix not yet initialized. Call to axbMatCreateEnd() required.\n"
            ,"axbMatSetValuesDense");
    aVar2 = mat->init;
  }
  return aVar2;
}

Assistant:

axbStatus_t axbMatSetValuesDense(struct axbMat_s *mat, void *values, axbDataType_t values_datatype)
{
  if (mat->init != 119347) {
    fprintf(stderr, "ERROR in %s: Matrix not yet initialized. Call to axbMatCreateEnd() required.\n", __func__);
    return mat->init;
  }

  axbStatus_t status;
  if (mat->storage_type == AXB_STORAGE_CSR) {

    status = axbMemBackendFree(mat->memBackend, mat->row_markers); AXB_ERRCHK(status);
    status = axbMemBackendFree(mat->memBackend, mat->col_indices); AXB_ERRCHK(status);
    status = axbMemBackendFree(mat->memBackend, mat->values); AXB_ERRCHK(status);

    status = axbMemBackendMalloc(mat->memBackend, sizeof(int)    * (mat->rows+1),           &(mat->row_markers)); AXB_ERRCHK(status);
    status = axbMemBackendMalloc(mat->memBackend, sizeof(int)    * (mat->rows * mat->cols), &(mat->col_indices)); AXB_ERRCHK(status);
    status = axbMemBackendMalloc(mat->memBackend, sizeof(double) * (mat->rows * mat->cols), &(mat->values)); AXB_ERRCHK(status);

    // create temporary array for rows and columns:
    int *tmp_rows = malloc(sizeof(int)    * (mat->rows+1));
    int *tmp_cols = malloc(sizeof(int)    * (mat->rows * mat->cols));

    tmp_rows[0] = 0;
    int index = 0;
    for (int i=0; i<(int)mat->rows; ++i) {
      for (int j=0; j<(int)mat->cols; ++j) {
        tmp_cols[index++] = j;
      }
      tmp_rows[i+1] = index;
    }

    status = axbMemBackendCopyIn(mat->memBackend, values, values_datatype, mat->row_markers, mat->row_markers_datatype, mat->rows + 1); AXB_ERRCHK(status);
    status = axbMemBackendCopyIn(mat->memBackend, values, values_datatype, mat->col_indices, mat->col_indices_datatype, mat->rows * mat->cols); AXB_ERRCHK(status);
    status = axbMemBackendCopyIn(mat->memBackend, values, values_datatype, mat->values,      mat->values_datatype,      mat->rows * mat->cols); AXB_ERRCHK(status);

    free(tmp_rows);
    free(tmp_cols);
  }
  else if (mat->storage_type == AXB_STORAGE_DENSE)
  {
    status = axbMemBackendCopyIn(mat->memBackend, values, values_datatype, mat->values, mat->values_datatype, mat->rows * mat->cols); AXB_ERRCHK(status);
  } else {
    // TODO: implement
    return 1;
  }

  return 0;
}